

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O3

uint fl_utf8fromwc(char *dst,uint dstlen,wchar_t *src,uint srclen)

{
  wchar_t wVar1;
  char cVar2;
  wchar_t wVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  if (dstlen == 0) {
    uVar7 = 0;
    uVar9 = 0;
LAB_001fe44e:
    if (uVar7 < srclen) {
      uVar5 = (ulong)uVar7;
      do {
        wVar3 = src[uVar5];
        iVar6 = 1;
        if ((0x7f < (uint)wVar3) && (iVar6 = 2, 0x7ff < (uint)wVar3)) {
          iVar6 = ((uint)(wVar3 + L'\xffff0000') < 0x100000) + 3;
        }
        uVar9 = uVar9 + iVar6;
        uVar5 = uVar5 + 1;
      } while (srclen != uVar5);
    }
  }
  else {
    if (srclen == 0) {
      uVar5 = 0;
    }
    else {
      uVar8 = 0;
      uVar5 = 0;
      do {
        wVar3 = src[uVar8];
        uVar7 = (uint)uVar5;
        iVar6 = (int)uVar8;
        if ((uint)wVar3 < 0x80) {
          uVar9 = uVar7 + 1;
          cVar2 = (char)wVar3;
          if (dstlen <= uVar9) {
            cVar2 = '\0';
          }
          dst[uVar5] = cVar2;
          if (dstlen <= uVar9) {
            uVar7 = iVar6 + 1;
            goto LAB_001fe44e;
          }
        }
        else {
          if ((uint)wVar3 < 0x800) {
            uVar9 = uVar7 + 2;
            if (dstlen <= uVar9) {
LAB_001fe43b:
              uVar7 = iVar6 + 1;
              dst[uVar5] = '\0';
              goto LAB_001fe44e;
            }
            bVar4 = (byte)((uint)wVar3 >> 6) | 0xc0;
            iVar6 = 1;
            uVar10 = uVar7;
          }
          else {
            wVar1 = wVar3;
            if (((uint)wVar3 < 0x10000) || (wVar1 = L'�', 0x10ffff < (uint)wVar3)) {
              wVar3 = wVar1;
              uVar9 = uVar7 + 3;
              if (dstlen <= uVar9) {
                uVar7 = iVar6 + 1;
                dst[uVar5] = '\0';
                goto LAB_001fe44e;
              }
              uVar10 = uVar7 + 1;
              dst[uVar5] = (byte)((uint)wVar3 >> 0xc) | 0xe0;
              bVar4 = (byte)((uint)wVar3 >> 6) & 0x3f | 0x80;
              iVar6 = 2;
            }
            else {
              uVar9 = uVar7 + 4;
              if (dstlen <= uVar9) goto LAB_001fe43b;
              dst[uVar5] = (byte)((uint)wVar3 >> 0x12) | 0xf0;
              uVar10 = uVar7 + 2;
              dst[uVar7 + 1] = (byte)((uint)wVar3 >> 0xc) & 0x3f | 0x80;
              bVar4 = (byte)((uint)wVar3 >> 6) & 0x3f | 0x80;
              iVar6 = 3;
            }
          }
          dst[uVar10] = bVar4;
          dst[uVar7 + iVar6] = (byte)wVar3 & 0x3f | 0x80;
        }
        uVar5 = (ulong)uVar9;
        uVar8 = uVar8 + 1;
      } while (srclen != uVar8);
    }
    uVar9 = (uint)uVar5;
    dst[uVar5] = '\0';
  }
  return uVar9;
}

Assistant:

unsigned fl_utf8fromwc(char* dst, unsigned dstlen,
		    const wchar_t* src, unsigned srclen) {
  unsigned i = 0;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned ucs;
    if (i >= srclen) {dst[count] = 0; return count;}
    ucs = src[i++];
    if (ucs < 0x80U) {
      dst[count++] = ucs;
      if (count >= dstlen) {dst[count-1] = 0; break;}
    } else if (ucs < 0x800U) { /* 2 bytes */
      if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
      dst[count++] = 0xc0 | (ucs >> 6);
      dst[count++] = 0x80 | (ucs & 0x3F);
#if defined(WIN32) || defined(__CYGWIN__)
    } else if (ucs >= 0xd800 && ucs <= 0xdbff && i < srclen &&
	       src[i] >= 0xdc00 && src[i] <= 0xdfff) {
      /* surrogate pair */
      unsigned ucs2 = src[i++];
      ucs = 0x10000U + ((ucs&0x3ff)<<10) + (ucs2&0x3ff);
      /* all surrogate pairs turn into 4-byte UTF-8 */
#else
    } else if (ucs >= 0x10000) {
      if (ucs > 0x10ffff) {
	ucs = 0xfffd;
	goto J1;
      }
#endif
      if (count+4 >= dstlen) {dst[count] = 0; count += 4; break;}
      dst[count++] = 0xf0 | (ucs >> 18);
      dst[count++] = 0x80 | ((ucs >> 12) & 0x3F);
      dst[count++] = 0x80 | ((ucs >> 6) & 0x3F);
      dst[count++] = 0x80 | (ucs & 0x3F);
    } else {
#if !(defined(WIN32) || defined(__CYGWIN__))
    J1:
#endif
      /* all others are 3 bytes: */
      if (count+3 >= dstlen) {dst[count] = 0; count += 3; break;}
      dst[count++] = 0xe0 | (ucs >> 12);
      dst[count++] = 0x80 | ((ucs >> 6) & 0x3F);
      dst[count++] = 0x80 | (ucs & 0x3F);
    }
  }
  /* we filled dst, measure the rest: */
  while (i < srclen) {
    unsigned ucs = src[i++];
    if (ucs < 0x80U) {
      count++;
    } else if (ucs < 0x800U) { /* 2 bytes */
      count += 2;
#if defined(WIN32) || defined(__CYGWIN__)
    } else if (ucs >= 0xd800 && ucs <= 0xdbff && i < srclen-1 &&
	       src[i+1] >= 0xdc00 && src[i+1] <= 0xdfff) {
      /* surrogate pair */
      ++i;
#else
    } else if (ucs >= 0x10000 && ucs <= 0x10ffff) {
#endif
      count += 4;
    } else {
      count += 3;
    }
  }
  return count;
}